

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp analyze_let_syntax_aux(sexp ctx,sexp x,int recp,int depth)

{
  ulong uVar1;
  undefined4 localp;
  undefined8 uVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp unaff_retaddr;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp ctx2;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp env;
  sexp res;
  sexp in_stack_ffffffffffffff78;
  sexp in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  sexp in_stack_ffffffffffffff90;
  sexp_conflict *local_68;
  sexp_gc_var_t *psVar3;
  sexp ctx_00;
  sexp local_40;
  undefined1 local_38 [20];
  undefined8 in_stack_ffffffffffffffe0;
  
  stack0xffffffffffffffd8 = 0x43e;
  memset(local_38,0,0x10);
  local_40 = (sexp)0x43e;
  memset(&stack0xffffffffffffffb0,0,0x10);
  memset(&local_68,0,0x10);
  local_38._0_8_ = local_38 + 0x10;
  local_38._8_8_ = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)local_38;
  ctx_00 = (sexp)&local_40;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffb0;
  local_68 = (sexp_conflict *)&stack0xffffffffffffffa8;
  psVar3 = *(sexp_gc_var_t **)((long)&((sexp)in_RDI)->value + 0x6078);
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&local_68;
  if ((((((((sexp)in_RSI)->value).string.offset & 3) == 0) &&
       (((((sexp)in_RSI)->value).type.cpl)->tag == 6)) &&
      (((((((sexp)in_RSI)->value).type.cpl)->value).string.offset & 3) == 0)) &&
     (((((((sexp)in_RSI)->value).type.cpl)->value).type.cpl)->tag == 6)) {
    register0x00000000 =
         sexp_alloc_tagged_aux
                   (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                    (sexp_uint_t)in_stack_ffffffffffffff80);
    ((sexp)register0x00000000)->field_0x5 = ((sexp)register0x00000000)->field_0x5 & 0xf7 | 8;
    (((sexp)register0x00000000)->value).flonum = (double)(((sexp)in_RDI)->value).type.cpl;
    (((sexp)register0x00000000)->value).uvector.length = 0x23e;
    (((sexp)register0x00000000)->value).bytecode.length = 0x23e;
    local_40 = sexp_make_child_context(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    uVar2 = stack0xffffffffffffffd8;
    (local_40->value).type.cpl = (sexp)stack0xffffffffffffffd8;
    uVar1 = (ulong)stack0xffffffffffffffd8 >> 0x20;
    localp = (int)uVar1;
    unique0x100003cc = uVar2;
    uVar2 = analyze_bind_syntax((sexp)in_RSI,(sexp)CONCAT44(in_EDX,in_ECX),
                                (sexp)in_stack_ffffffffffffffe0,localp);
    if (((uVar2 & 3) != 0) || (((sexp)uVar2)->tag != 0x13)) {
      uVar2 = analyze_seq(ctx_00,(sexp)uVar2,(int)((ulong)psVar3 >> 0x20),(int)psVar3);
    }
  }
  else {
    uVar2 = sexp_compile_error(unaff_retaddr,(char *)in_RDI,(sexp)in_RSI);
  }
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)local_38._8_8_;
  return (sexp)uVar2;
}

Assistant:

static sexp analyze_let_syntax_aux (sexp ctx, sexp x, int recp, int depth) {
  sexp res;
  sexp_gc_var3(env, ctx2, tmp);
  sexp_gc_preserve3(ctx, env, ctx2, tmp);
  if (! (sexp_pairp(sexp_cdr(x)) && sexp_pairp(sexp_cddr(x)))) {
    res = sexp_compile_error(ctx, "bad let(rec)-syntax", x);
  } else {
    env = sexp_alloc_type(ctx, env, SEXP_ENV);
    sexp_env_syntactic_p(env) = 1;
    sexp_env_parent(env) = sexp_context_env(ctx);
    sexp_env_bindings(env) = SEXP_NULL;
#if SEXP_USE_STABLE_ABI || SEXP_USE_RENAME_BINDINGS
    sexp_env_renames(env) = SEXP_NULL;
#endif
    ctx2 = sexp_make_child_context(ctx, sexp_context_lambda(ctx));
    sexp_context_env(ctx2) = env;
    tmp = analyze_bind_syntax(sexp_cadr(x), (recp ? ctx2 : ctx), ctx2, 1);
    res = (sexp_exceptionp(tmp) ? tmp : analyze_seq(ctx2, sexp_cddr(x), depth, 1));
  }
  sexp_gc_release3(ctx);
  return res;
}